

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::Desugarer::makeObject(Desugarer *this,Object *ast,uint obj_level)

{
  pointer pOVar1;
  sockaddr *__addr;
  DesugaredObject *pDVar2;
  Identifier *id;
  AST *body;
  ostream *poVar3;
  Self *pSVar4;
  ObjectField *field;
  pointer pOVar5;
  LocationRange *args;
  pointer ppVar6;
  AST *retval;
  SuperVars svs;
  Binds binds;
  Fields new_fields;
  ASTs new_asserts;
  DesugaredObject *local_1c8;
  _Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  local_1c0;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_> local_1a8;
  _Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  local_188;
  _List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> local_168;
  ObjectField local_150;
  
  if (obj_level == 0) {
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_150,L"$",(allocator<char32_t> *)&local_1c0);
    id = Desugarer::id(this,(UString *)&local_150);
    ::std::__cxx11::u32string::~u32string((u32string *)&local_150);
    body = &make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                      (this,(LocationRange *)E,
                       (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                        *)EF)->super_AST;
    ObjectField::Local(&local_150,(Fodder *)EF,(Fodder *)EF,id,(Fodder *)EF,body,(Fodder *)EF);
    ::std::vector<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>::
    emplace_back<jsonnet::internal::ObjectField>(&ast->fields,&local_150);
    ObjectField::~ObjectField(&local_150);
  }
  desugarFields((SuperVars *)&local_1c0,this,&ast->super_AST,&ast->fields,obj_level);
  local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168._M_impl._M_node._M_size = 0;
  pOVar1 = (ast->fields).
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_168._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_168;
  local_168._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_168;
  for (pOVar5 = (ast->fields).
                super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
                ._M_impl.super__Vector_impl_data._M_start; pOVar5 != pOVar1; pOVar5 = pOVar5 + 1) {
    if (pOVar5->kind == FIELD_EXPR) {
      ::std::
      vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
      ::
      emplace_back<jsonnet::internal::ObjectField::Hide_const&,jsonnet::internal::AST*const&,jsonnet::internal::AST*const&>
                ((vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
                  *)&local_188,&pOVar5->hide,&pOVar5->expr1,&pOVar5->expr2);
    }
    else if (pOVar5->kind == ASSERT) {
      ::std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
      push_back((list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *)
                &local_168,&pOVar5->expr2);
    }
    else {
      poVar3 = ::std::operator<<((ostream *)&::std::cerr,
                                 "INTERNAL ERROR: field should have been desugared: ");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,pOVar5->kind);
      ::std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  args = &(ast->super_AST).location;
  local_1c8 = make<jsonnet::internal::DesugaredObject,jsonnet::internal::LocationRange&,std::__cxx11::list<jsonnet::internal::AST*,std::allocator<jsonnet::internal::AST*>>&,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>&>
                        (this,args,
                         (list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>
                          *)&local_168,
                         (vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                          *)&local_188);
  if (local_1c0._M_impl.super__Vector_impl_data._M_finish !=
      local_1c0._M_impl.super__Vector_impl_data._M_start) {
    local_1a8.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.
    super__Vector_base<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (ppVar6 = local_1c0._M_impl.super__Vector_impl_data._M_start;
        ppVar6 != local_1c0._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      if (ppVar6->second == (AST *)0x0) {
        __addr = (sockaddr *)ppVar6->first;
        pSVar4 = make<jsonnet::internal::Self,jsonnet::internal::LocationRange_const&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&>
                           (this,(LocationRange *)E,
                            (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                             *)EF);
        bind((Desugarer *)&local_150,(int)this,__addr,(socklen_t)pSVar4);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&local_1a8,(Bind *)&local_150);
      }
      else {
        bind((Desugarer *)&local_150,(int)this,(sockaddr *)ppVar6->first,(socklen_t)ppVar6->second);
        ::std::
        vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
        emplace_back<jsonnet::internal::Local::Bind>(&local_1a8,(Bind *)&local_150);
      }
      Local::Bind::~Bind((Bind *)&local_150);
    }
    local_1c8 = (DesugaredObject *)
                make<jsonnet::internal::Local,jsonnet::internal::LocationRange&,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,std::vector<jsonnet::internal::Local::Bind,std::allocator<jsonnet::internal::Local::Bind>>&,jsonnet::internal::AST*&>
                          (this,args,
                           (vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                            *)EF,&local_1a8,(AST **)&local_1c8);
    ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
    ~vector(&local_1a8);
  }
  pDVar2 = local_1c8;
  ::std::__cxx11::_List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
  _M_clear(&local_168);
  ::std::
  _Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ::~_Vector_base(&local_188);
  ::std::
  _Vector_base<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*,_jsonnet::internal::AST_*>_>_>
  ::~_Vector_base(&local_1c0);
  return &pDVar2->super_AST;
}

Assistant:

AST* makeObject(Object *ast, unsigned obj_level) {
        // Hidden variable to allow outer/top binding.
        if (obj_level == 0) {
            const Identifier *hidden_var = id(U"$");
            auto *body = make<Self>(E, EF);
            ast->fields.push_back(ObjectField::Local(EF, EF, hidden_var, EF, body, EF));
        }

        SuperVars svs = desugarFields(ast, ast->fields, obj_level);

        DesugaredObject::Fields new_fields;
        ASTs new_asserts;
        for (const ObjectField &field : ast->fields) {
            if (field.kind == ObjectField::ASSERT) {
                new_asserts.push_back(field.expr2);
            } else if (field.kind == ObjectField::FIELD_EXPR) {
                new_fields.emplace_back(field.hide, field.expr1, field.expr2);
            } else {
                std::cerr << "INTERNAL ERROR: field should have been desugared: " << field.kind
                          << std::endl;
            }
        }

        AST* retval = make<DesugaredObject>(ast->location, new_asserts, new_fields);
        if (svs.size() > 0) {
            Local::Binds binds;
            for (const auto &pair : svs) {
                if (pair.second == nullptr) {
                    // Self binding
                    binds.push_back(bind(pair.first, make<Self>(E, EF)));
                } else {
                    // Super binding
                    binds.push_back(bind(pair.first, pair.second));
                }
            }
            retval = make<Local>(ast->location, EF, binds, retval);
        }

        return retval;
    }